

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O2

void __thiscall icu_63::RuleBasedTimeZone::deleteRules(RuleBasedTimeZone *this)

{
  long *plVar1;
  UVector *pUVar2;
  
  if (this->fInitialRule != (InitialTimeZoneRule *)0x0) {
    (*(this->fInitialRule->super_TimeZoneRule).super_UObject._vptr_UObject[1])();
  }
  this->fInitialRule = (InitialTimeZoneRule *)0x0;
  pUVar2 = this->fHistoricRules;
  if (pUVar2 != (UVector *)0x0) {
    while (pUVar2->count != 0) {
      plVar1 = (long *)UVector::orphanElementAt(pUVar2,0);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))(plVar1);
      }
      pUVar2 = this->fHistoricRules;
    }
    (*(pUVar2->super_UObject)._vptr_UObject[1])();
    this->fHistoricRules = (UVector *)0x0;
  }
  pUVar2 = this->fFinalRules;
  if (pUVar2 != (UVector *)0x0) {
    while (pUVar2->count != 0) {
      plVar1 = (long *)UVector::orphanElementAt(pUVar2,0);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 8))(plVar1);
      }
      pUVar2 = this->fFinalRules;
    }
    (*(pUVar2->super_UObject)._vptr_UObject[1])();
    this->fFinalRules = (UVector *)0x0;
  }
  return;
}

Assistant:

void
RuleBasedTimeZone::deleteRules(void) {
    delete fInitialRule;
    fInitialRule = NULL;
    if (fHistoricRules != NULL) {
        while (!fHistoricRules->isEmpty()) {
            delete (TimeZoneRule*)(fHistoricRules->orphanElementAt(0));
        }
        delete fHistoricRules;
        fHistoricRules = NULL;
    }
    if (fFinalRules != NULL) {
        while (!fFinalRules->isEmpty()) {
            delete (AnnualTimeZoneRule*)(fFinalRules->orphanElementAt(0));
        }
        delete fFinalRules;
        fFinalRules = NULL;
    }
}